

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void spirv_cross::inner::
     join_helper<std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_long&,char_const(&)[3]>
               (StringStream<4096UL,_4096UL> *stream,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
               char (*ts_1) [2],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,
               char (*ts_3) [2],unsigned_long *ts_4,char (*ts_5) [3])

{
  StringStream<4096UL,_4096UL>::operator<<(stream,t);
  join_helper<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_long&,char_const(&)[3]>
            (stream,ts,ts_1,ts_2,ts_3,ts_4,ts_5);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}